

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_log_register_callback(ma_log *pLog,ma_log_callback callback)

{
  uint uVar1;
  void *in_RDX;
  ma_log_callback_proc in_RSI;
  ma_log *in_RDI;
  ma_result result;
  ma_result local_24;
  ma_result local_4;
  
  local_24 = MA_SUCCESS;
  if ((in_RDI == (ma_log *)0x0) || (in_RSI == (ma_log_callback_proc)0x0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    ma_log_lock(in_RDI);
    if (in_RDI->callbackCount == 4) {
      local_24 = MA_OUT_OF_MEMORY;
    }
    else {
      uVar1 = in_RDI->callbackCount;
      in_RDI->callbacks[uVar1].onLog = in_RSI;
      in_RDI->callbacks[uVar1].pUserData = in_RDX;
      in_RDI->callbackCount = in_RDI->callbackCount + 1;
    }
    ma_log_unlock(in_RDI);
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_log_register_callback(ma_log* pLog, ma_log_callback callback)
{
    ma_result result = MA_SUCCESS;

    if (pLog == NULL || callback.onLog == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        if (pLog->callbackCount == ma_countof(pLog->callbacks)) {
            result = MA_OUT_OF_MEMORY;  /* Reached the maximum allowed log callbacks. */
        } else {
            pLog->callbacks[pLog->callbackCount] = callback;
            pLog->callbackCount += 1;
        }
    }
    ma_log_unlock(pLog);

    return result;
}